

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeSetNumCols(Vdbe *p,int nResColumn)

{
  int N;
  void *pvVar1;
  int in_ESI;
  sqlite3 *in_RDI;
  sqlite3 *db;
  int n;
  sqlite3 *db_00;
  undefined4 uVar2;
  
  uVar2 = 0xaaaaaaaa;
  db_00 = (sqlite3 *)in_RDI->pVfs;
  if (*(short *)((long)&(in_RDI->init).newTnum + 2) != 0) {
    releaseMemArray((Mem *)db,(int)((ulong)in_RDI >> 0x20));
    sqlite3DbFree((sqlite3 *)CONCAT44(in_ESI,uVar2),db_00);
  }
  N = in_ESI * 5;
  *(short *)((long)&(in_RDI->init).newTnum + 2) = (short)in_ESI;
  *(short *)&(in_RDI->init).newTnum = (short)in_ESI;
  pvVar1 = sqlite3DbMallocRawNN(in_RDI,CONCAT44(in_ESI,N));
  *(void **)(in_RDI->aLimit + 4) = pvVar1;
  if (*(long *)(in_RDI->aLimit + 4) != 0) {
    initMemArray(*(Mem **)(in_RDI->aLimit + 4),N,db_00,1);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSetNumCols(Vdbe *p, int nResColumn){
  int n;
  sqlite3 *db = p->db;

  if( p->nResAlloc ){
    releaseMemArray(p->aColName, p->nResAlloc*COLNAME_N);
    sqlite3DbFree(db, p->aColName);
  }
  n = nResColumn*COLNAME_N;
  p->nResColumn = p->nResAlloc = (u16)nResColumn;
  p->aColName = (Mem*)sqlite3DbMallocRawNN(db, sizeof(Mem)*n );
  if( p->aColName==0 ) return;
  initMemArray(p->aColName, n, db, MEM_Null);
}